

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.h
# Opt level: O2

shared_ptr<Expr> __thiscall Parser::rel(Parser *this)

{
  int iVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Parser *in_RSI;
  shared_ptr<Expr> sVar3;
  shared_ptr<Token> tok;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  __shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2> local_30;
  __shared_ptr<Rel,_(__gnu_cxx::_Lock_policy)2> local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  sVar3 = expr(this);
  _Var2 = sVar3.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  iVar1 = ((in_RSI->look).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->tag;
  if ((((iVar1 == 0x3c) || (iVar1 == 0x3e)) || (iVar1 == 0x10b)) || (iVar1 == 0x107)) {
    std::__shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_30,&(in_RSI->look).super___shared_ptr<Token,_(__gnu_cxx::_Lock_policy)2>);
    move(in_RSI);
    expr((Parser *)&stack0xffffffffffffffc0);
    std::make_shared<Rel,std::shared_ptr<Token>&,std::shared_ptr<Expr>&,std::shared_ptr<Expr>>
              ((shared_ptr<Token> *)&local_20,(shared_ptr<Expr> *)&local_30,(shared_ptr<Expr> *)this
              );
    std::__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Expr,(__gnu_cxx::_Lock_policy)2> *)this,&local_20);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
    _Var2._M_pi = extraout_RDX;
  }
  sVar3.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<Expr>)sVar3.super___shared_ptr<Expr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Expr> rel() {
		std::shared_ptr<Expr> x = expr();
		switch (look->tag) {
		case '<':
		case LE:
		case GE:
		case '>':
			{
				std::shared_ptr<Token> tok = look; move();
				x = std::make_shared<Rel>(tok, x, expr());
			}
		default:
			return x;
			break;
		}
	}